

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_3x3_pack4.h
# Opt level: O0

void ncnn::pooling3x3s2_max_pack4_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float *pfVar8;
  long in_RSI;
  long in_RDI;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128 _max1;
  __m128 _max0;
  __m128 _r22_1;
  __m128 _r21_1;
  __m128 _r20_1;
  __m128 _r12_1;
  __m128 _r11_1;
  __m128 _r10_1;
  __m128 _r02_1;
  __m128 _r01_1;
  __m128 _r00_1;
  __m128 _max11;
  __m128 _max10;
  __m128 _r24;
  __m128 _r23;
  __m128 _r14;
  __m128 _r13;
  __m128 _r04;
  __m128 _r03;
  __m128 _max01;
  __m128 _max00;
  __m128 _r22;
  __m128 _r21;
  __m128 _r20;
  __m128 _r12;
  __m128 _r11;
  __m128 _r10;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  int j;
  int i;
  float *r2;
  float *r1;
  float *r0;
  float *outptr;
  Mat img0;
  int q;
  int tailstep;
  int outh;
  int outw;
  int inch;
  int w;
  undefined8 local_6f8;
  undefined8 uVar13;
  Mat *this;
  undefined1 local_6e8 [16];
  undefined8 uStack_6e0;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  int local_510;
  int local_50c;
  undefined1 (*local_508) [16];
  undefined1 (*local_500) [16];
  undefined1 (*local_4f8) [16];
  Mat local_4e0;
  float *local_498;
  Mat local_490;
  int local_448;
  int local_444;
  int local_440;
  int local_43c;
  int local_438;
  int local_434;
  undefined1 (*local_418) [16];
  undefined1 (*local_410) [16];
  undefined1 (*local_408) [16];
  undefined1 (*local_400) [16];
  undefined1 (*local_3f8) [16];
  undefined1 (*local_3f0) [16];
  undefined1 (*local_3e8) [16];
  undefined1 (*local_3e0) [16];
  undefined1 (*local_3d8) [16];
  undefined1 (*local_3d0) [16];
  undefined1 (*local_3c8) [16];
  undefined1 (*local_3c0) [16];
  undefined1 (*local_3b8) [16];
  undefined1 (*local_3b0) [16];
  undefined1 (*local_3a8) [16];
  undefined1 (*local_3a0) [16];
  undefined1 (*local_398) [16];
  undefined1 (*local_390) [16];
  undefined1 (*local_388) [16];
  undefined1 (*local_380) [16];
  undefined1 (*local_378) [16];
  undefined1 (*local_370) [16];
  undefined1 (*local_368) [16];
  undefined1 (*local_360) [16];
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  float *local_40;
  undefined1 local_38 [16];
  float *local_20;
  undefined1 local_18 [16];
  float *local_8;
  
  local_434 = *(int *)(in_RDI + 0x2c);
  local_438 = *(int *)(in_RDI + 0x38);
  local_43c = *(int *)(in_RSI + 0x2c);
  local_440 = *(int *)(in_RSI + 0x30);
  local_444 = (local_434 * 2 + local_43c * -2) * 4;
  for (local_448 = 0; local_448 < local_438; local_448 = local_448 + 1) {
    Mat::channel(this,local_6f8._12_4_);
    Mat::channel(this,local_6f8._12_4_);
    pfVar8 = Mat::operator_cast_to_float_(&local_4e0);
    Mat::~Mat((Mat *)0x4b89d4);
    local_498 = pfVar8;
    local_4f8 = (undefined1 (*) [16])Mat::row(&local_490,0);
    local_500 = (undefined1 (*) [16])Mat::row(&local_490,1);
    local_508 = (undefined1 (*) [16])Mat::row(&local_490,2);
    for (local_50c = 0; local_50c < local_440; local_50c = local_50c + 1) {
      for (local_510 = 0; local_510 + 1 < local_43c; local_510 = local_510 + 2) {
        local_360 = local_4f8;
        local_68 = *(undefined8 *)*local_4f8;
        uStack_60 = *(undefined8 *)(*local_4f8 + 8);
        local_368 = local_4f8 + 1;
        local_78 = *(undefined8 *)*local_368;
        uStack_70 = *(undefined8 *)(local_4f8[1] + 8);
        local_370 = local_4f8 + 2;
        local_198 = *(undefined8 *)*local_370;
        uStack_190 = *(undefined8 *)(local_4f8[2] + 8);
        auVar1 = *local_370;
        local_378 = local_500;
        local_b8 = *(undefined8 *)*local_500;
        uStack_b0 = *(undefined8 *)(*local_500 + 8);
        local_380 = local_500 + 1;
        local_d8 = *(undefined8 *)*local_380;
        uStack_d0 = *(undefined8 *)(local_500[1] + 8);
        local_388 = local_500 + 2;
        local_1e8 = *(undefined8 *)*local_388;
        uStack_1e0 = *(undefined8 *)(local_500[2] + 8);
        auVar4 = *local_388;
        local_390 = local_508;
        local_f8 = *(undefined8 *)*local_508;
        uStack_f0 = *(undefined8 *)(*local_508 + 8);
        local_398 = local_508 + 1;
        local_118 = *(undefined8 *)*local_398;
        uStack_110 = *(undefined8 *)(local_508[1] + 8);
        local_3a0 = local_508 + 2;
        local_238 = *(undefined8 *)*local_3a0;
        uStack_230 = *(undefined8 *)(local_508[2] + 8);
        auVar7 = *local_3a0;
        auVar9 = maxps(*local_4f8,*local_368);
        local_5b8 = auVar9._0_8_;
        local_88 = local_5b8;
        uStack_5b0 = auVar9._8_8_;
        uStack_80 = uStack_5b0;
        auVar9 = maxps(auVar9,*local_370);
        local_5b8 = auVar9._0_8_;
        local_a8 = local_5b8;
        uStack_5b0 = auVar9._8_8_;
        uStack_a0 = uStack_5b0;
        auVar9 = maxps(auVar9,*local_500);
        local_5b8 = auVar9._0_8_;
        local_c8 = local_5b8;
        uStack_5b0 = auVar9._8_8_;
        uStack_c0 = uStack_5b0;
        auVar10 = maxps(auVar9,*local_380);
        auVar9 = maxps(*local_388,*local_508);
        local_5c8 = auVar9._0_8_;
        local_108 = local_5c8;
        uStack_5c0 = auVar9._8_8_;
        uStack_100 = uStack_5c0;
        auVar9 = maxps(auVar9,*local_398);
        local_5c8 = auVar9._0_8_;
        local_128 = local_5c8;
        uStack_5c0 = auVar9._8_8_;
        uStack_120 = uStack_5c0;
        auVar11 = maxps(auVar9,*local_3a0);
        local_3a8 = local_4f8 + 3;
        local_168 = *(undefined8 *)*local_3a8;
        uStack_160 = *(undefined8 *)(local_4f8[3] + 8);
        auVar9 = *local_3a8;
        local_3b0 = local_4f8 + 4;
        local_178 = *(undefined8 *)*local_3b0;
        uStack_170 = *(undefined8 *)(local_4f8[4] + 8);
        auVar12 = *local_3b0;
        local_3b8 = local_500 + 3;
        local_1b8 = *(undefined8 *)*local_3b8;
        uStack_1b0 = *(undefined8 *)(local_500[3] + 8);
        auVar2 = *local_3b8;
        local_3c0 = local_500 + 4;
        local_1d8 = *(undefined8 *)*local_3c0;
        uStack_1d0 = *(undefined8 *)(local_500[4] + 8);
        auVar3 = *local_3c0;
        local_3c8 = local_508 + 3;
        local_1f8 = *(undefined8 *)*local_3c8;
        uStack_1f0 = *(undefined8 *)(local_508[3] + 8);
        auVar5 = *local_3c8;
        local_3d0 = local_508 + 4;
        local_218 = *(undefined8 *)*local_3d0;
        uStack_210 = *(undefined8 *)(local_508[4] + 8);
        auVar6 = *local_3d0;
        local_8 = local_498;
        local_5b8 = auVar10._0_8_;
        local_148 = local_5b8;
        uStack_5b0 = auVar10._8_8_;
        uStack_140 = uStack_5b0;
        local_5c8 = auVar11._0_8_;
        local_158 = local_5c8;
        uStack_5c0 = auVar11._8_8_;
        uStack_150 = uStack_5c0;
        local_18 = maxps(auVar10,auVar11);
        *(undefined8 *)local_498 = local_18._0_8_;
        *(undefined8 *)(local_498 + 2) = local_18._8_8_;
        auVar9 = maxps(auVar9,auVar12);
        local_638 = auVar9._0_8_;
        local_188 = local_638;
        uStack_630 = auVar9._8_8_;
        uStack_180 = uStack_630;
        auVar9 = maxps(auVar9,auVar1);
        local_638 = auVar9._0_8_;
        local_1a8 = local_638;
        uStack_630 = auVar9._8_8_;
        uStack_1a0 = uStack_630;
        auVar9 = maxps(auVar9,auVar2);
        local_638 = auVar9._0_8_;
        local_1c8 = local_638;
        uStack_630 = auVar9._8_8_;
        uStack_1c0 = uStack_630;
        auVar9 = maxps(auVar9,auVar3);
        auVar12 = maxps(auVar4,auVar5);
        local_638 = auVar9._0_8_;
        local_208 = local_638;
        uStack_630 = auVar9._8_8_;
        uStack_200 = uStack_630;
        auVar9 = maxps(auVar9,auVar6);
        local_638 = auVar9._0_8_;
        local_228 = local_638;
        uStack_630 = auVar9._8_8_;
        uStack_220 = uStack_630;
        auVar9 = maxps(auVar9,auVar7);
        local_20 = local_498 + 4;
        local_638 = auVar9._0_8_;
        local_248 = local_638;
        uStack_630 = auVar9._8_8_;
        uStack_240 = uStack_630;
        local_648 = auVar12._0_8_;
        local_258 = local_648;
        uStack_640 = auVar12._8_8_;
        uStack_250 = uStack_640;
        local_38 = maxps(auVar9,auVar12);
        *(undefined8 *)local_20 = local_38._0_8_;
        *(undefined8 *)(local_498 + 6) = local_38._8_8_;
        local_4f8 = local_4f8 + 4;
        local_500 = local_500 + 4;
        local_508 = local_508 + 4;
        local_498 = local_498 + 8;
        local_138 = local_238;
        uStack_130 = uStack_230;
        local_e8 = local_1e8;
        uStack_e0 = uStack_1e0;
        local_98 = local_198;
        uStack_90 = uStack_190;
      }
      for (; local_510 < local_43c; local_510 = local_510 + 1) {
        local_3d8 = local_4f8;
        local_268 = *(undefined8 *)*local_4f8;
        uStack_260 = *(undefined8 *)(*local_4f8 + 8);
        local_3e0 = local_4f8 + 1;
        local_278 = *(undefined8 *)*local_3e0;
        uStack_270 = *(undefined8 *)(local_4f8[1] + 8);
        local_3e8 = local_4f8 + 2;
        local_298 = *(undefined8 *)*local_3e8;
        uStack_290 = *(undefined8 *)(local_4f8[2] + 8);
        local_3f0 = local_500;
        local_2b8 = *(undefined8 *)*local_500;
        uStack_2b0 = *(undefined8 *)(*local_500 + 8);
        local_3f8 = local_500 + 1;
        local_2d8 = *(undefined8 *)*local_3f8;
        uStack_2d0 = *(undefined8 *)(local_500[1] + 8);
        local_400 = local_500 + 2;
        local_2e8 = *(undefined8 *)*local_400;
        uStack_2e0 = *(undefined8 *)(local_500[2] + 8);
        local_408 = local_508;
        local_2f8 = *(undefined8 *)*local_508;
        uStack_2f0 = *(undefined8 *)(*local_508 + 8);
        local_410 = local_508 + 1;
        local_318 = *(undefined8 *)*local_410;
        uStack_310 = *(undefined8 *)(local_508[1] + 8);
        local_418 = local_508 + 2;
        local_338 = *(undefined8 *)*local_418;
        uStack_330 = *(undefined8 *)(local_508[2] + 8);
        auVar9 = maxps(*local_4f8,*local_3e0);
        this = auVar9._0_8_;
        local_288 = this;
        uStack_6e0 = auVar9._8_8_;
        uStack_280 = uStack_6e0;
        auVar9 = maxps(auVar9,*local_3e8);
        this = auVar9._0_8_;
        local_2a8 = this;
        uStack_6e0 = auVar9._8_8_;
        uStack_2a0 = uStack_6e0;
        auVar9 = maxps(auVar9,*local_500);
        this = auVar9._0_8_;
        local_2c8 = this;
        uStack_6e0 = auVar9._8_8_;
        uStack_2c0 = uStack_6e0;
        local_6e8 = maxps(auVar9,*local_3f8);
        auVar9 = maxps(*local_400,*local_508);
        local_6f8 = auVar9._0_8_;
        local_308 = local_6f8;
        uVar13 = auVar9._8_8_;
        uStack_300 = uVar13;
        auVar9 = maxps(auVar9,*local_410);
        local_6f8 = auVar9._0_8_;
        local_328 = local_6f8;
        uVar13 = auVar9._8_8_;
        uStack_320 = uVar13;
        _local_6f8 = maxps(auVar9,*local_418);
        local_40 = local_498;
        uStack_340 = uStack_6e0;
        local_358 = local_6f8;
        local_58 = maxps(local_6e8,_local_6f8);
        *(undefined8 *)local_498 = local_58._0_8_;
        *(undefined8 *)(local_498 + 2) = local_58._8_8_;
        local_4f8 = local_4f8 + 2;
        local_500 = local_500 + 2;
        local_508 = local_508 + 2;
        local_498 = local_498 + 4;
        uStack_350 = uVar13;
        local_348 = this;
      }
      local_4f8 = (undefined1 (*) [16])(*local_4f8 + (long)local_444 * 4);
      local_500 = (undefined1 (*) [16])(*local_500 + (long)local_444 * 4);
      local_508 = (undefined1 (*) [16])(*local_508 + (long)local_444 * 4);
    }
    Mat::~Mat((Mat *)0x4b9579);
  }
  return;
}

Assistant:

static void pooling3x3s2_max_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 4;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j + 1 < outw; j += 2)
            {
                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                __m128 _max00 = _mm_max_ps(_r00, _r01);
                _max00 = _mm_max_ps(_max00, _r02);
                _max00 = _mm_max_ps(_max00, _r10);
                _max00 = _mm_max_ps(_max00, _r11);
                __m128 _max01 = _mm_max_ps(_r12, _r20);
                _max01 = _mm_max_ps(_max01, _r21);
                _max01 = _mm_max_ps(_max01, _r22);

                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r04 = _mm_loadu_ps(r0 + 16);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r14 = _mm_loadu_ps(r1 + 16);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                __m128 _r24 = _mm_loadu_ps(r2 + 16);

                _mm_storeu_ps(outptr, _mm_max_ps(_max00, _max01));

                __m128 _max10 = _mm_max_ps(_r03, _r04);
                _max10 = _mm_max_ps(_max10, _r02);
                _max10 = _mm_max_ps(_max10, _r13);
                _max10 = _mm_max_ps(_max10, _r14);
                __m128 _max11 = _mm_max_ps(_r12, _r23);
                _max10 = _mm_max_ps(_max10, _r24);
                _max10 = _mm_max_ps(_max10, _r22);

                _mm_storeu_ps(outptr + 4, _mm_max_ps(_max10, _max11));

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr += 8;
            }

            for (; j < outw; j++)
            {
                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                __m128 _max0 = _mm_max_ps(_r00, _r01);
                _max0 = _mm_max_ps(_max0, _r02);
                _max0 = _mm_max_ps(_max0, _r10);
                _max0 = _mm_max_ps(_max0, _r11);
                __m128 _max1 = _mm_max_ps(_r12, _r20);
                _max1 = _mm_max_ps(_max1, _r21);
                _max1 = _mm_max_ps(_max1, _r22);

                _mm_storeu_ps(outptr, _mm_max_ps(_max0, _max1));

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr += 4;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}